

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_read_signature_restartable
              (mbedtls_ecdsa_context *ctx,uchar *hash,size_t hlen,uchar *sig,size_t slen,
              mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  uchar *end_00;
  undefined1 local_88 [8];
  mbedtls_mpi s;
  mbedtls_mpi r;
  size_t len;
  uchar *end;
  uchar *p;
  mbedtls_ecdsa_restart_ctx *pmStack_38;
  int ret;
  mbedtls_ecdsa_restart_ctx *rs_ctx_local;
  size_t slen_local;
  uchar *sig_local;
  size_t hlen_local;
  uchar *hash_local;
  mbedtls_ecdsa_context *ctx_local;
  
  p._4_4_ = 0xffffff92;
  end_00 = sig + slen;
  end = sig;
  pmStack_38 = rs_ctx;
  rs_ctx_local = (mbedtls_ecdsa_restart_ctx *)slen;
  slen_local = (size_t)sig;
  sig_local = (uchar *)hlen;
  hlen_local = (size_t)hash;
  hash_local = (uchar *)ctx;
  mbedtls_mpi_init((mbedtls_mpi *)&s.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_88);
  p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&r.p,0x30);
  if (p._4_4_ == 0) {
    if (end + (long)r.p == end_00) {
      p._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)&s.p);
      if ((p._4_4_ == 0) &&
         (p._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)local_88), p._4_4_ == 0)) {
        p._4_4_ = ecdsa_verify_restartable
                            ((mbedtls_ecp_group *)hash_local,(uchar *)hlen_local,(size_t)sig_local,
                             (mbedtls_ecp_point *)(hash_local + 0x110),(mbedtls_mpi *)&s.p,
                             (mbedtls_mpi *)local_88,pmStack_38);
        if ((p._4_4_ == 0) && (end != end_00)) {
          p._4_4_ = -0x4c00;
        }
      }
      else {
        p._4_4_ = p._4_4_ + -0x4f80;
      }
    }
    else {
      p._4_4_ = -0x4fe6;
    }
  }
  else {
    p._4_4_ = p._4_4_ + -0x4f80;
  }
  mbedtls_mpi_free((mbedtls_mpi *)&s.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_88);
  return p._4_4_;
}

Assistant:

int mbedtls_ecdsa_read_signature_restartable( mbedtls_ecdsa_context *ctx,
                          const unsigned char *hash, size_t hlen,
                          const unsigned char *sig, size_t slen,
                          mbedtls_ecdsa_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = (unsigned char *) sig;
    const unsigned char *end = sig + slen;
    size_t len;
    mbedtls_mpi r, s;
    ECDSA_VALIDATE_RET( ctx  != NULL );
    ECDSA_VALIDATE_RET( hash != NULL );
    ECDSA_VALIDATE_RET( sig  != NULL );

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( p + len != end )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
        goto cleanup;
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &r ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &s ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }
#if defined(MBEDTLS_ECDSA_VERIFY_ALT)
    if( ( ret = mbedtls_ecdsa_verify( &ctx->grp, hash, hlen,
                                      &ctx->Q, &r, &s ) ) != 0 )
        goto cleanup;
#else
    if( ( ret = ecdsa_verify_restartable( &ctx->grp, hash, hlen,
                              &ctx->Q, &r, &s, rs_ctx ) ) != 0 )
        goto cleanup;
#endif /* MBEDTLS_ECDSA_VERIFY_ALT */

    /* At this point we know that the buffer starts with a valid signature.
     * Return 0 if the buffer just contains the signature, and a specific
     * error code if the valid signature is followed by more data. */
    if( p != end )
        ret = MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH;

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}